

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O2

void ELFIO::dump::section_header(ostream *out,Elf_Half no,section *sec,uchar elf_class)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined7 in_register_00000009;
  Elf_Xword flags;
  Elf_Xword flags_00;
  uint key;
  string local_90 [32];
  string local_70;
  string local_50 [32];
  
  key = *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  poVar4 = std::operator<<(out,"[");
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 5;
  poVar4 = std::operator<<(poVar4,0x20);
  lVar1 = *(long *)poVar4;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 2;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,no);
  poVar4 = std::operator<<(poVar4,"] ");
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x11;
  poVar4 = std::operator<<(poVar4,0x20);
  lVar1 = *(long *)poVar4;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xffffff4f | 0x20;
  if ((int)CONCAT71(in_register_00000009,elf_class) == 1) {
    (*sec->_vptr_section[5])(sec);
    str_section_type<unsigned_int>(key);
    poVar4 = std::operator<<(poVar4,local_50);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,"0x");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
    poVar4 = std::operator<<(poVar4,0x30);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0x11])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,"0x");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
    poVar4 = std::operator<<(poVar4,0x30);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0x13])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,"0x");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 2;
    poVar4 = std::operator<<(poVar4,0x30);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0xf])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," ");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 3;
    poVar4 = std::operator<<(poVar4,0x20);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xffffff4f | 0x20;
    iVar3 = (*sec->_vptr_section[7])(sec);
    section_flags_abi_cxx11_(&local_70,(dump *)CONCAT44(extraout_var,iVar3),flags);
    poVar4 = std::operator<<(poVar4,(string *)&local_70);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,"0x");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 2;
    poVar4 = std::operator<<(poVar4,0x30);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0xb])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,"0x");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 3;
    poVar4 = std::operator<<(poVar4,0x30);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[9])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,"0x");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 2;
    poVar4 = std::operator<<(poVar4,0x30);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0xd])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," ");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x11;
    poVar4 = std::operator<<(poVar4,0x20);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xffffff4f | 0x20;
    (*sec->_vptr_section[3])(local_90,sec);
    poVar4 = std::operator<<(poVar4,local_90);
    poVar4 = std::operator<<(poVar4," ");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    (*sec->_vptr_section[5])(sec);
    str_section_type<unsigned_int>(key);
    poVar4 = std::operator<<(poVar4,local_50);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,"0x");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x10;
    poVar4 = std::operator<<(poVar4,0x30);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0x11])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,"0x");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x10;
    poVar4 = std::operator<<(poVar4,0x30);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0x13])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,"0x");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
    poVar4 = std::operator<<(poVar4,0x30);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0x17])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," ");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 3;
    poVar4 = std::operator<<(poVar4,0x20);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xffffff4f | 0x20;
    iVar3 = (*sec->_vptr_section[7])(sec);
    section_flags_abi_cxx11_(&local_70,(dump *)CONCAT44(extraout_var_00,iVar3),flags_00);
    poVar4 = std::operator<<(poVar4,(string *)&local_70);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
    poVar4 = std::operator<<(poVar4,0x20);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xffffff4f | 0x20;
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,"0x");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 4;
    poVar4 = std::operator<<(poVar4,0x30);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0xf])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,"0x");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 4;
    poVar4 = std::operator<<(poVar4,0x30);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0xb])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,"0x");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 4;
    poVar4 = std::operator<<(poVar4,0x30);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[9])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,"0x");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 4;
    poVar4 = std::operator<<(poVar4,0x30);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0xd])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,"   ");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x11;
    poVar4 = std::operator<<(poVar4,0x20);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xffffff4f | 0x20;
    (*sec->_vptr_section[3])(local_90,sec);
    poVar4 = std::operator<<(poVar4,local_90);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string(local_50);
  *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = key;
  return;
}

Assistant:

static void section_header( std::ostream&  out,
                                Elf_Half       no,
                                const section* sec,
                                unsigned char  elf_class )
    {
        std::ios_base::fmtflags original_flags = out.flags();

        // clang-format off
        if ( elf_class == ELFCLASS32 ) { // Output for 32-bit
            out << "[" << DUMP_DEC_FORMAT( 5 ) << no << "] "
                << DUMP_STR_FORMAT( 17 ) << str_section_type( sec->get_type() )
                << " " << DUMP_HEX0x_FORMAT( 8 ) << sec->get_address() << " "
                << DUMP_HEX0x_FORMAT( 8 ) << sec->get_size() << " "
                << DUMP_HEX0x_FORMAT( 2 ) << sec->get_entry_size() << " "
                << DUMP_STR_FORMAT( 3 ) << section_flags( sec->get_flags() )
                << " " << DUMP_HEX0x_FORMAT( 2 ) << sec->get_link() << " "
                << DUMP_HEX0x_FORMAT( 3 ) << sec->get_info() << " "
                << DUMP_HEX0x_FORMAT( 2 ) << sec->get_addr_align() << " "
                << DUMP_STR_FORMAT( 17 ) << sec->get_name() << " " << std::endl;
        }
        else { // Output for 64-bit
            out << "[" << DUMP_DEC_FORMAT( 5 ) << no << "] "
                << DUMP_STR_FORMAT( 17 ) << str_section_type( sec->get_type() ) << " "
                << DUMP_HEX0x_FORMAT( 16 ) << sec->get_address()                  << " "
                << DUMP_HEX0x_FORMAT( 16 ) << sec->get_size()                     << " "
                << DUMP_HEX0x_FORMAT(  8 ) << sec->get_offset()                   << " "
                << DUMP_STR_FORMAT(  3) << section_flags( sec->get_flags() )
                << std::endl
                << DUMP_STR_FORMAT( 8 ) << " "
                << DUMP_HEX0x_FORMAT( 4 ) << sec->get_entry_size() << " "
                << DUMP_HEX0x_FORMAT( 4 ) << sec->get_link()       << " "
                << DUMP_HEX0x_FORMAT( 4 ) << sec->get_info()       << " "
                << DUMP_HEX0x_FORMAT( 4 ) << sec->get_addr_align() << "   "
                << DUMP_STR_FORMAT( 17 ) << sec->get_name()
                << std::endl;
        }
        // clang-format on

        out.flags( original_flags );

        return;
    }